

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_data_into_fd.c
# Opt level: O0

int pad_to(archive *a,int fd,int can_lseek,size_t nulls_size,char *nulls,int64_t target_offset,
          int64_t actual_offset)

{
  __off_t _Var1;
  int *piVar2;
  ssize_t sVar3;
  ssize_t bytes_written;
  size_t to_write;
  int64_t target_offset_local;
  char *nulls_local;
  size_t nulls_size_local;
  int can_lseek_local;
  int fd_local;
  archive *a_local;
  
  if (can_lseek == 0) {
    for (; actual_offset < target_offset; actual_offset = sVar3 + actual_offset) {
      bytes_written = nulls_size;
      if (target_offset < (long)(actual_offset + nulls_size)) {
        bytes_written = target_offset - actual_offset;
      }
      sVar3 = write(fd,nulls,bytes_written);
      if (sVar3 < 0) {
        piVar2 = __errno_location();
        archive_set_error(a,*piVar2,"Write error");
        return -0x1e;
      }
    }
    a_local._4_4_ = 0;
  }
  else {
    _Var1 = lseek(fd,target_offset - actual_offset,1);
    if (_Var1 == target_offset) {
      a_local._4_4_ = 0;
    }
    else {
      piVar2 = __errno_location();
      archive_set_error(a,*piVar2,"Seek error");
      a_local._4_4_ = -0x1e;
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
pad_to(struct archive *a, int fd, int can_lseek,
    size_t nulls_size, const char *nulls,
    int64_t target_offset, int64_t actual_offset)
{
	size_t to_write;
	ssize_t bytes_written;

	if (can_lseek) {
		actual_offset = lseek(fd,
		    target_offset - actual_offset, SEEK_CUR);
		if (actual_offset != target_offset) {
			archive_set_error(a, errno, "Seek error");
			return (ARCHIVE_FATAL);
		}
		return (ARCHIVE_OK);
	}
	while (target_offset > actual_offset) {
		to_write = nulls_size;
		if (target_offset < actual_offset + (int64_t)nulls_size)
			to_write = (size_t)(target_offset - actual_offset);
		bytes_written = write(fd, nulls, to_write);
		if (bytes_written < 0) {
			archive_set_error(a, errno, "Write error");
			return (ARCHIVE_FATAL);
		}
		actual_offset += bytes_written;
	}
	return (ARCHIVE_OK);
}